

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double derivative_in_direction(vw *all,bfgs *b,float *mem,int *origin)

{
  long in_RDI;
  dense_parameters *in_stack_00000030;
  int *in_stack_00000038;
  sparse_parameters *in_stack_00000040;
  bfgs *in_stack_00000048;
  vw *in_stack_00000050;
  bfgs *in_stack_00000058;
  vw *in_stack_00000060;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 0x3590) & 1) == 0) {
    local_8 = derivative_in_direction<dense_parameters>
                        (in_stack_00000050,in_stack_00000048,(float *)in_stack_00000040,
                         in_stack_00000038,in_stack_00000030);
  }
  else {
    local_8 = derivative_in_direction<sparse_parameters>
                        (in_stack_00000060,in_stack_00000058,(float *)in_stack_00000050,
                         (int *)in_stack_00000048,in_stack_00000040);
  }
  return local_8;
}

Assistant:

double derivative_in_direction(vw& all, bfgs& b, float* mem, int& origin)
{
  if (all.weights.sparse)
    return derivative_in_direction(all, b, mem, origin, all.weights.sparse_weights);
  else
    return derivative_in_direction(all, b, mem, origin, all.weights.dense_weights);
}